

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::GenerateRuleFile
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *output)

{
  int iVar1;
  undefined4 extraout_var;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  char *replace;
  
  local_40.View_._M_str = (output->_M_dataplus)._M_p;
  local_40.View_._M_len = output->_M_string_length;
  local_70.View_._M_len = 5;
  local_70.View_._M_str = ".rule";
  cmStrCat<>(__return_storage_ptr__,&local_40,&local_70);
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
  replace = (char *)CONCAT44(extraout_var,iVar1);
  if ((replace != (char *)0x0) && (*replace == '$')) {
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,replace,"/CMakeFiles");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateRuleFile(
  std::string const& output) const
{
  std::string ruleFile = cmStrCat(output, ".rule");
  const char* dir = this->GetCMakeCFGIntDir();
  if (dir && dir[0] == '$') {
    cmSystemTools::ReplaceString(ruleFile, dir, "/CMakeFiles");
  }
  return ruleFile;
}